

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prngSTBStepR(void *buf,size_t count,void *state)

{
  ushort uVar1;
  prng_stb_st *in_RDX;
  long in_RSI;
  char *in_RDI;
  prng_stb_st *s;
  u16 u;
  long local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_10 != 0) {
    uVar1 = in_RDX->u;
    _prngSTBClock(in_RDX);
    *local_8 = (char)in_RDX->u + (char)((ulong)uVar1 / 0xff);
    local_8 = local_8 + 1;
    local_10 = local_10 + -1;
  }
  return;
}

Assistant:

void prngSTBStepR(void* buf, size_t count, void* state)
{
	register u16 u;
	prng_stb_st* s = (prng_stb_st*)state;
	// pre
	ASSERT(memIsValid(s, sizeof(prng_stb_st)));
	ASSERT(memIsValid(buf, count));
	// генерировать
	while (count--)
	{
		u = s->u;
		_prngSTBClock(s);
		*((octet*)buf) = (s->u) + u / 255;
		buf = (octet*)buf + 1;
	}
	u = 0;
}